

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

void __thiscall despot::Tag::Tag(Tag *this)

{
  int iVar1;
  reference pvVar2;
  value_type local_3b0;
  int local_338;
  int s;
  int opp;
  int rob;
  istringstream iss;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string map;
  Tag *this_local;
  
  map.field_2._8_8_ = this;
  BaseTag::BaseTag(&this->super_BaseTag);
  *(undefined ***)&this->super_BaseTag = &PTR__Tag_001589f0;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__Tag_00158b20;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__Tag_00158c28;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__Tag_00158c60;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__Tag_00158c88;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->obs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"mapSize = 5 10\n",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"#####...##\n",&local_109)
  ;
  std::operator+(&local_b0,&local_d0,&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"#####...##\n",&local_131)
  ;
  std::operator+(&local_90,&local_b0,&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"#####...##\n",&local_159)
  ;
  std::operator+(&local_70,&local_90,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"...........\n",&local_181);
  std::operator+(&local_50,&local_70,&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"...........",&local_1a9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::istringstream::istringstream((istringstream *)&opp,(string *)local_30,_S_in);
  BaseTag::Init(&this->super_BaseTag,(istream *)&opp);
  iVar1 = despot::Floor::NumCells();
  (this->super_BaseTag).same_loc_obs_ = (long)iVar1;
  iVar1 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->obs_,(long)iVar1);
  s = 0;
  while( true ) {
    iVar1 = despot::Floor::NumCells();
    if (iVar1 <= s) break;
    local_338 = 0;
    while( true ) {
      iVar1 = despot::Floor::NumCells();
      if (iVar1 <= local_338) break;
      iVar1 = BaseTag::RobOppIndicesToStateIndex(&this->super_BaseTag,s,local_338);
      if (s == local_338) {
        local_3b0 = (this->super_BaseTag).same_loc_obs_;
      }
      else {
        local_3b0 = (value_type)s;
      }
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->obs_,(long)iVar1);
      *pvVar2 = local_3b0;
      local_338 = local_338 + 1;
    }
    s = s + 1;
  }
  (this->super_BaseTag).robot_pos_unknown_ = false;
  std::__cxx11::istringstream::~istringstream((istringstream *)&opp);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

Tag::Tag() {
	string map = string("mapSize = 5 10\n") + string("#####...##\n")
		+ string("#####...##\n") + string("#####...##\n")
		+ string("...........\n") + string("...........");
	istringstream iss(map);
	Init(iss);

	same_loc_obs_ = floor_.NumCells();
	obs_.resize(NumStates());
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			int s = RobOppIndicesToStateIndex(rob, opp);
			obs_[s] = (rob == opp ? same_loc_obs_ : rob);
		}
	}
  robot_pos_unknown_ = false;
}